

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall ExprVisitorTest_InvalidExpr_Test::TestBody(ExprVisitorTest_InvalidExpr_Test *this)

{
  bool bVar1;
  MockSpec<void_*(unsigned_long)> *call;
  undefined8 in_RDI;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  LogicalConstant e2;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  NumericConstant e1;
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> f;
  char buffer [100];
  NiceMock<MockAllocator> alloc;
  AnythingMatcher *in_stack_fffffffffffffbc8;
  NiceMock<MockAllocator> *in_stack_fffffffffffffbd0;
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *in_stack_fffffffffffffbd8
  ;
  ExprBase in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbec;
  NiceMock<MockAllocator> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  Type in_stack_fffffffffffffbfc;
  AssertionResult *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  Action<void_*(unsigned_long)> *in_stack_fffffffffffffc48;
  Action<void_*(unsigned_long)> *action;
  TypedExpectation<void_*(unsigned_long)> *in_stack_fffffffffffffc50;
  char *obj;
  int line;
  NiceMock<MockAllocator> *alloc_00;
  MockSpec<void_*(unsigned_long)> *in_stack_fffffffffffffce0;
  allocator<char> local_2e1;
  string local_2e0 [32];
  AssertionResult local_2c0;
  undefined4 local_2ac;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_2a8;
  char *local_2a0;
  int local_250;
  Impl *local_248;
  byte local_232;
  allocator<char> local_231;
  string local_230 [32];
  AssertionResult local_210;
  undefined4 local_1fc;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_1f8;
  char *local_1f0;
  AllocatorRef<testing::NiceMock<MockAllocator>,_char> local_1b0 [23];
  undefined1 local_f8 [248];
  
  line = (int)((ulong)in_RDI >> 0x20);
  alloc_00 = (NiceMock<MockAllocator> *)local_f8;
  testing::NiceMock<MockAllocator>::NiceMock(in_stack_fffffffffffffbf0);
  AllocatorRef<testing::NiceMock<MockAllocator>,_char>::AllocatorRef(local_1b0,alloc_00);
  mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::BasicExprFactory
            ((BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *)
             in_stack_fffffffffffffbd0,
             (AllocatorRef<testing::NiceMock<MockAllocator>,_char> *)in_stack_fffffffffffffbc8);
  obj = local_f8 + 8;
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffbc8);
  call = MockAllocator::gmock_allocate
                   ((MockAllocator *)in_stack_fffffffffffffbd0,
                    (Matcher<unsigned_long> *)in_stack_fffffffffffffbc8);
  testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
            (in_stack_fffffffffffffce0,(char *)alloc_00,line,obj,(char *)call);
  local_1f0 = (char *)testing::Return<char*>((char *)in_stack_fffffffffffffbc8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<char_*> *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  testing::Action<void_*(unsigned_long)>::~Action((Action<void_*(unsigned_long)> *)0x14a66a);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x14a677);
  local_1f8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
       MakeNumericConstant(in_stack_fffffffffffffbd8,(double)in_stack_fffffffffffffbd0);
  local_1fc = 0;
  std::fill<char*,int>
            ((char *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,(int *)0x14a6c9);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
    std::allocator<char>::~allocator(&local_231);
    local_232 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_248 = (Impl *)local_1f8.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbd8,
                 (NumericConstant)in_stack_fffffffffffffbe0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 f.super_AllocatorRef<testing::NiceMock<MockAllocator>,_char>.alloc_,
                 (Expr)f.exprs_.
                       super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((local_232 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffc00,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_250 = 2;
    }
    else {
      local_250 = 0;
    }
    std::__cxx11::string::~string(local_230);
    if (local_250 != 0) goto LAB_0014aaf2;
  }
  else {
LAB_0014aaf2:
    testing::Message::Message((Message *)in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc50 =
         (TypedExpectation<void_*(unsigned_long)> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x14ab0e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
               (char *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (char *)in_stack_fffffffffffffbe0.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffc50,(Message *)in_stack_fffffffffffffc48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbd0);
    testing::Message::~Message((Message *)0x14ab71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14abc9);
  action = (Action<void_*(unsigned_long)> *)(local_f8 + 8);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffbc8);
  MockAllocator::gmock_allocate
            ((MockAllocator *)in_stack_fffffffffffffbd0,
             (Matcher<unsigned_long> *)in_stack_fffffffffffffbc8);
  testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
            (in_stack_fffffffffffffce0,(char *)alloc_00,line,obj,(char *)call);
  local_2a0 = (char *)testing::Return<char*>((char *)in_stack_fffffffffffffbc8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<char_*> *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (in_stack_fffffffffffffc50,action);
  testing::Action<void_*(unsigned_long)>::~Action((Action<void_*(unsigned_long)> *)0x14ac8f);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x14ac9c);
  local_2a8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
       MakeLogicalConstant(in_stack_fffffffffffffbd8,
                           SUB81((ulong)in_stack_fffffffffffffbd0 >> 0x38,0));
  local_2ac = 0;
  std::fill<char*,int>
            ((char *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,(int *)0x14ace7);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc08,(allocator<char> *)in_stack_fffffffffffffc00);
    std::allocator<char>::~allocator(&local_2e1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffbd8,
                 (LogicalConstant)in_stack_fffffffffffffbe0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 f.super_AllocatorRef<testing::NiceMock<MockAllocator>,_char>.alloc_,
                 (Expr)f.exprs_.
                       super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffc00,
               (char (*) [104])CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    local_250 = 3;
    std::__cxx11::string::~string(local_2e0);
    if (local_250 == 0) goto LAB_0014b175;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffc00);
  in_stack_fffffffffffffbd0 =
       (NiceMock<MockAllocator> *)
       testing::AssertionResult::failure_message((AssertionResult *)0x14b0d0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
             (char *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             (char *)in_stack_fffffffffffffbe0.impl_);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffc50,(Message *)action);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbd0);
  testing::Message::~Message((Message *)0x14b12d);
LAB_0014b175:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b182);
  mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::~BasicExprFactory
            ((BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *)
             in_stack_fffffffffffffbd0);
  testing::NiceMock<MockAllocator>::~NiceMock(in_stack_fffffffffffffbd0);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, InvalidExpr) {
  using ::testing::_;
  typedef AllocatorRef< ::testing::NiceMock<MockAllocator> > Allocator;
  ::testing::NiceMock<MockAllocator> alloc;
  char buffer[100];
  mp::BasicExprFactory<Allocator> f((Allocator(&alloc)));

  // Corrupt a numeric expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e1 = f.MakeNumericConstant(0);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e1), "invalid expression");

  // Corrupt a logical expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e2 = f.MakeLogicalConstant(false);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e2), "invalid expression");
}